

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineeFrameInfo.cpp
# Opt level: O2

Var __thiscall BailoutConstantValue::ToVar(BailoutConstantValue *this,Func *func)

{
  code *pcVar1;
  bool bVar2;
  IRType type;
  undefined4 *puVar3;
  anon_union_8_3_5e50e90d_for_u aVar4;
  Var pvVar5;
  
  type = this->type;
  if ((type != TyFloat64) && (type != TyVar)) {
    bVar2 = IRType_IsSignedInt(type);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.cpp"
                         ,0x25,
                         "(this->type == TyVar || this->type == TyFloat64 || IRType_IsSignedInt(this->type))"
                         ,
                         "this->type == TyVar || this->type == TyFloat64 || IRType_IsSignedInt(this->type)"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    type = this->type;
  }
  if (type != TyFloat64) {
    if (type == TyVar) {
      aVar4 = this->u;
    }
    else {
      bVar2 = IRType_IsSignedInt(type);
      if ((!bVar2) || (4 < TySize[this->type])) {
        aVar4 = (anon_union_8_3_5e50e90d_for_u)(double)(long)this->u;
        goto LAB_0050f22c;
      }
      aVar4 = (anon_union_8_3_5e50e90d_for_u)((ulong)*(uint *)&this->u | 0x1000000000000);
    }
    return (Var)aVar4;
  }
  aVar4 = this->u;
LAB_0050f22c:
  pvVar5 = Func::AllocateNumber(func,(double)aVar4);
  return pvVar5;
}

Assistant:

Js::Var BailoutConstantValue::ToVar(Func* func) const
{
    Assert(this->type == TyVar || this->type == TyFloat64 || IRType_IsSignedInt(this->type));
    Js::Var varValue;
    if (this->type == TyVar)
    {
        varValue = this->u.varConst.value;
    }
    else if (this->type == TyFloat64)
    {
        varValue = func->AllocateNumber((double)this->u.floatConst.value);
    }
    else if (IRType_IsSignedInt(this->type) && TySize[this->type] <= 4 && !Js::TaggedInt::IsOverflow((int32)this->u.intConst.value))
    {
        varValue = Js::TaggedInt::ToVarUnchecked((int32)this->u.intConst.value);
    }
    else
    {
        varValue = func->AllocateNumber((double)this->u.intConst.value);
    }
    return varValue;

}